

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

void __thiscall Js::InternalFrameInfo::Clear(InternalFrameInfo *this)

{
  this->codeAddress = (void *)0x0;
  this->framePointer = (void *)0x0;
  this->stackCheckCodeHeight = 0xffffffff;
  this->frameType = InternalFrameType_None;
  this->function = (JavascriptFunction *)0x0;
  this->hasInlinedFramesOnStack = false;
  this->previousInterpreterFrameIsFromBailout = false;
  return;
}

Assistant:

void InternalFrameInfo::Clear()
    {
        this->codeAddress = nullptr;
        this->framePointer = nullptr;
        this->stackCheckCodeHeight = (uint)-1;
        this->frameType = InternalFrameType_None;
        this->function = nullptr;
        this->hasInlinedFramesOnStack = false;
        this->previousInterpreterFrameIsFromBailout = false;
    }